

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O3

void bssl::dtls1_finish_flight(SSL *ssl)

{
  ushort uVar1;
  DTLS1_STATE *pDVar2;
  
  pDVar2 = ssl->d1;
  if (((pDVar2->outgoing_messages).size_ != '\0') && (uVar1 = *(ushort *)pDVar2, (uVar1 & 2) == 0))
  {
    if (*(ushort *)((pDVar2->outgoing_messages).storage_ + 0x10) < 3) {
      (pDVar2->records_to_ack).storage_.size_ = '\0';
      (pDVar2->records_to_ack).start_ = '\0';
      DTLSTimer::Stop(&pDVar2->ack_timer);
      *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xffbf;
      pDVar2 = ssl->d1;
      uVar1 = *(ushort *)pDVar2;
    }
    *(ushort *)pDVar2 = uVar1 | 2;
    *(ushort *)ssl->d1 = *(ushort *)ssl->d1 | 0x20;
    dtls1_stop_timer(ssl);
    return;
  }
  return;
}

Assistant:

void dtls1_finish_flight(SSL *ssl) {
  if (ssl->d1->outgoing_messages.empty() ||
      ssl->d1->outgoing_messages_complete) {
    return;  // Nothing to do.
  }

  if (ssl->d1->outgoing_messages[0].epoch <= 2) {
    // DTLS 1.3 handshake messages (epoch 2 and below) implicitly ACK the
    // previous flight, so there is no need to ACK previous records. This
    // clears the ACK buffer slightly earlier than the specification suggests.
    // See the discussion in
    // https://mailarchive.ietf.org/arch/msg/tls/kjJnquJOVaWxu5hUCmNzB35eqY0/
    ssl->d1->records_to_ack.Clear();
    ssl->d1->ack_timer.Stop();
    ssl->d1->sending_ack = false;
  }

  ssl->d1->outgoing_messages_complete = true;
  ssl->d1->sending_flight = true;
  // Stop retransmitting the previous flight. In DTLS 1.3, we'll have stopped
  // the timer already, but DTLS 1.2 keeps it running until the next flight is
  // ready.
  dtls1_stop_timer(ssl);
}